

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RootObjectBase.cpp
# Opt level: O0

PropertyIndex __thiscall
Js::RootObjectBase::GetRootPropertyIndex(RootObjectBase *this,PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  undefined4 *puVar5;
  DynamicTypeHandler *pDVar6;
  ScriptContext *this_00;
  PropertyRecord *pPVar7;
  PropertyId propertyId_local;
  RootObjectBase *this_local;
  
  BVar3 = IsInternalPropertyId(propertyId);
  if (BVar3 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RootObjectBase.cpp"
                                ,0xd1,"(!Js::IsInternalPropertyId(propertyId))",
                                "!Js::IsInternalPropertyId(propertyId)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RootObjectBase.cpp"
                                ,0xd2,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pDVar6 = DynamicObject::GetTypeHandler(&this->super_DynamicObject);
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  pPVar7 = ScriptContext::GetPropertyName(this_00,propertyId);
  iVar4 = (*pDVar6->_vptr_DynamicTypeHandler[0x1e])(pDVar6,pPVar7);
  return (PropertyIndex)iVar4;
}

Assistant:

PropertyIndex
    RootObjectBase::GetRootPropertyIndex(PropertyId propertyId)
    {
        Assert(!Js::IsInternalPropertyId(propertyId));
        Assert(propertyId != Constants::NoProperty);
        return GetTypeHandler()->GetRootPropertyIndex(this->GetScriptContext()->GetPropertyName(propertyId));
    }